

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_game.cc
# Opt level: O2

HanabiMove __thiscall hanabi_learning_env::HanabiGame::ConstructMove(HanabiGame *this,int uid)

{
  long lVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uStack_40;
  
  uVar6 = 0xff00000000000000;
  uVar8 = 0xff000000000000;
  uVar7 = 0xff;
  uVar9 = 0xff;
  if (-1 < uid) {
    iVar2 = MaxMoves(this);
    if (uid < iVar2) {
      iVar2 = this->hand_size_;
      uVar4 = uid - iVar2;
      if (uid < iVar2) {
        uStack_40 = 2;
        uVar7 = (ulong)(uint)uid;
      }
      else {
        iVar3 = uVar4 - iVar2;
        if ((int)uVar4 < iVar2) {
          uStack_40 = 1;
          uVar7 = (ulong)uVar4;
        }
        else {
          iVar2 = this->num_colors_;
          iVar5 = (this->num_players_ + -1) * iVar2;
          if (iVar3 < iVar5) {
            uVar9 = (ulong)(uint)(iVar3 / iVar2);
            uVar8 = (ulong)(iVar3 % iVar2 & 0xff) << 0x30;
            uStack_40 = 3;
          }
          else {
            lVar1 = (long)(iVar3 - iVar5);
            uVar9 = lVar1 / (long)this->num_ranks_ & 0xffffffff;
            uVar6 = lVar1 % (long)this->num_ranks_ << 0x38;
            uStack_40 = 4;
          }
          uVar9 = uVar9 + 1;
        }
      }
      goto LAB_00115257;
    }
  }
  uStack_40 = 0;
LAB_00115257:
  return (HanabiMove)((uVar7 & 0xff) << 0x20 | (uVar9 & 0xff) << 0x28 | uVar6 | uVar8 | uStack_40);
}

Assistant:

HanabiMove HanabiGame::ConstructMove(int uid) const {
  if (uid < 0 || uid >= MaxMoves()) {
    return HanabiMove(HanabiMove::kInvalid, /*card_index=*/-1,
                      /*target_offset=*/-1, /*color=*/-1, /*rank=*/-1);
  }
  if (uid < MaxDiscardMoves()) {
    return HanabiMove(HanabiMove::kDiscard, /*card_index=*/uid,
                      /*target_offset=*/-1, /*color=*/-1, /*rank=*/-1);
  }
  uid -= MaxDiscardMoves();
  if (uid < MaxPlayMoves()) {
    return HanabiMove(HanabiMove::kPlay, /*card_index=*/uid,
                      /*target_offset=*/-1, /*color=*/-1, /*rank=*/-1);
  }
  uid -= MaxPlayMoves();
  if (uid < MaxRevealColorMoves()) {
    return HanabiMove(HanabiMove::kRevealColor, /*card_index=*/-1,
                      /*target_offset=*/1 + uid / NumColors(),
                      /*color=*/uid % NumColors(), /*rank=*/-1);
  }
  uid -= MaxRevealColorMoves();
  return HanabiMove(HanabiMove::kRevealRank, /*card_index=*/-1,
                    /*target_offset=*/1 + uid / NumRanks(),
                    /*color=*/-1, /*rank=*/uid % NumRanks());
}